

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffercache.h
# Opt level: O1

size_t __thiscall
pbrt::BufferCache<pbrt::Vector3<float>_>::BufferHasher::operator()(BufferHasher *this,Buffer *b)

{
  long lVar1;
  float *pfVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  
  pfVar2 = (float *)b->ptr;
  uVar4 = (uint)b->size;
  uVar5 = (long)(int)uVar4 * -0x395b586ca42e166b;
  uVar3 = uVar4;
  if ((int)uVar4 < 0) {
    uVar3 = uVar4 + 7;
  }
  if (0xe < uVar4 + 7) {
    lVar6 = (long)((int)uVar3 >> 3) << 3;
    do {
      lVar1 = *(long *)pfVar2;
      pfVar2 = pfVar2 + 2;
      uVar5 = (((ulong)(lVar1 * -0x395b586ca42e166b) >> 0x2f ^ lVar1 * -0x395b586ca42e166b) *
               -0x395b586ca42e166b ^ uVar5) * -0x395b586ca42e166b;
      lVar6 = lVar6 + -8;
    } while (lVar6 != 0);
  }
  switch(uVar4 & 7) {
  case 7:
    uVar5 = uVar5 ^ (ulong)*(byte *)((long)pfVar2 + 6) << 0x30;
  case 6:
    uVar5 = uVar5 ^ (ulong)*(byte *)((long)pfVar2 + 5) << 0x28;
  case 5:
    uVar5 = uVar5 ^ (ulong)*(byte *)(pfVar2 + 1) << 0x20;
  case 4:
    uVar5 = uVar5 ^ (ulong)*(byte *)((long)pfVar2 + 3) << 0x18;
  case 3:
    uVar5 = uVar5 ^ (ulong)*(byte *)((long)pfVar2 + 2) << 0x10;
  case 2:
    uVar5 = uVar5 ^ (ulong)*(byte *)((long)pfVar2 + 1) << 8;
  case 1:
    uVar5 = (*(byte *)pfVar2 ^ uVar5) * -0x395b586ca42e166b;
  case 0:
    uVar5 = (uVar5 >> 0x2f ^ uVar5) * -0x395b586ca42e166b;
    return uVar5 >> 0x2f ^ uVar5;
  }
}

Assistant:

size_t operator()(const Buffer &b) const { return HashBuffer(b.ptr, b.size); }